

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_allocators.h
# Opt level: O0

void * __thiscall
density_tests::DeepTestAllocator<256UL>::allocate
          (DeepTestAllocator<256UL> *this,size_t i_size,size_t i_alignment,size_t i_alignment_offset
          )

{
  void *i_block;
  void *block;
  size_t i_alignment_offset_local;
  size_t i_alignment_local;
  size_t i_size_local;
  DeepTestAllocator<256UL> *this_local;
  
  exception_checkpoint();
  i_block = density::basic_default_allocator<256UL>::allocate
                      ((basic_default_allocator<256UL> *)this,i_size,i_alignment,i_alignment_offset)
  ;
  SharedBlockRegistry::register_block
            (&this->m_registry,2,i_block,i_size,i_alignment,i_alignment_offset);
  DeepTestAllocator<256ul>::invoke_hook<void*,unsigned_long,unsigned_long,unsigned_long>
            ((DeepTestAllocator<256ul> *)this,0x11,(void *)0x0,(unsigned_long)i_block,i_size,
             i_alignment);
  return i_block;
}

Assistant:

void * allocate(size_t i_size, size_t i_alignment, size_t i_alignment_offset = 0)
        {
            exception_checkpoint();

            auto block = Base::allocate(i_size, i_alignment, i_alignment_offset);
            m_registry.register_block(
              s_default_category, block, i_size, i_alignment, i_alignment_offset);
            invoke_hook(
              &IAllocatorHook::on_allocated_block, block, i_size, i_alignment, i_alignment_offset);
            return block;
        }